

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall Divide<5,_1,_4>::propagate(Divide<5,_1,_4> *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  IntVar *pIVar10;
  IntVar *pIVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  pIVar11 = (this->x).var;
  pIVar10 = (this->y).var;
  lVar8 = (long)(this->x).b;
  iVar4 = (pIVar11->min).v;
  iVar1 = (pIVar10->max).v;
  lVar15 = (long)(pIVar10->min).v;
  pIVar10 = (this->z).var;
  uVar3 = (this->z).b;
  lVar9 = (long)(int)uVar3;
  lVar12 = (pIVar10->min).v + lVar9;
  lVar13 = (pIVar10->max).v + lVar9;
  lVar17 = ~(long)(pIVar11->max).v + lVar8;
  lVar16 = -lVar15;
  lVar5 = (lVar17 - lVar15) / lVar16;
  lVar15 = lVar13;
  if (lVar12 < lVar5) {
    if (so.lazy) {
      iVar2 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[9])(pIVar11);
      uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (ulong)uVar3 << 0x20 | (long)iVar2 << 2 | 3;
      uVar3 = (this->z).b;
      pIVar10 = (this->z).var;
    }
    else {
      uVar6 = 0;
    }
    iVar2 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar10,lVar5 + (int)~uVar3 + 1,uVar6,1);
    if ((char)iVar2 == '\0') {
      return false;
    }
    pIVar10 = (this->z).var;
    lVar9 = (long)(this->z).b;
    lVar15 = (pIVar10->max).v + lVar9;
  }
  lVar8 = lVar8 - iVar4;
  lVar14 = -(long)iVar1;
  lVar5 = (lVar14 + lVar8 + -1) / lVar14;
  if (lVar5 < lVar15) {
    if (so.lazy == true) {
      iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
      lVar9 = (long)(this->z).b;
      pIVar10 = (this->z).var;
    }
    else {
      uVar6 = 0;
    }
    iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar10,lVar5 - lVar9,uVar6,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  uVar6 = lVar14 * (lVar12 + -1);
  pIVar11 = (this->x).var;
  lVar15 = (long)(this->x).b;
  if (lVar15 - (pIVar11->max).v <= (long)uVar6) {
    if (so.lazy == true) {
      iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar7 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
      lVar15 = (long)(this->x).b;
      pIVar11 = (this->x).var;
    }
    else {
      uVar7 = 0;
    }
    iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar11,lVar15 + ~uVar6,uVar7,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
    pIVar11 = (this->x).var;
    lVar15 = (long)(this->x).b;
  }
  lVar16 = lVar16 * lVar13;
  if (lVar16 < lVar15 - (pIVar11->min).v) {
    if (so.lazy == true) {
      iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
      lVar15 = (long)(this->x).b;
      pIVar11 = (this->x).var;
    }
    else {
      uVar6 = 0;
    }
    iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar11,lVar15 - lVar16,uVar6,1);
    if ((char)iVar4 == '\0') {
      return false;
    }
  }
  if (0 < lVar13) {
    lVar13 = (lVar17 + lVar13) / lVar13;
    pIVar11 = (this->y).var;
    lVar15 = (long)(pIVar11->max).v;
    lVar5 = -lVar15;
    if (lVar13 != lVar5 && SBORROW8(lVar13,lVar5) == lVar13 + lVar15 < 0) {
      if (so.lazy == true) {
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
        uVar6 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
        pIVar11 = (this->y).var;
      }
      else {
        uVar6 = 0;
      }
      iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])(pIVar11,-lVar13,uVar6,1);
      if ((char)iVar4 == '\0') {
        return false;
      }
    }
  }
  if (lVar12 < 2) {
    return true;
  }
  lVar15 = (lVar8 + lVar12 + -2) / (lVar12 + -1);
  pIVar11 = (this->y).var;
  lVar5 = (long)(pIVar11->min).v;
  lVar13 = -lVar5;
  if (lVar15 == lVar13 || SBORROW8(lVar15,lVar13) != lVar15 + lVar5 < 0) {
    if (so.lazy == true) {
      iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar3 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (ulong)uVar3 << 0x20 | (long)iVar4 << 2 | 3;
      pIVar11 = (this->y).var;
    }
    else {
      uVar6 = 0;
    }
    iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xe])(pIVar11,1 - lVar15,uVar6,1)
    ;
    if ((char)iVar4 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}